

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O1

wchar_t archive_read_format_tar_options(archive_read *a,char *key,char *val)

{
  void *pvVar1;
  int iVar2;
  wchar_t wVar3;
  archive_string_conv *paVar4;
  uint uVar5;
  
  pvVar1 = a->format->data;
  iVar2 = strcmp(key,"compat-2x");
  if (iVar2 == 0) {
    wVar3 = L'\0';
    uVar5 = 0;
    if (val != (char *)0x0) {
      uVar5 = (uint)(*val != '\0');
    }
    *(uint *)((long)pvVar1 + 0x1ac) = uVar5;
    *(uint *)((long)pvVar1 + 0x1a8) = uVar5;
  }
  else {
    iVar2 = strcmp(key,"hdrcharset");
    if (iVar2 == 0) {
      if ((val == (char *)0x0) || (*val == '\0')) {
        archive_set_error(&a->archive,-1,"tar: hdrcharset option needs a character-set name");
        wVar3 = L'\xffffffe7';
      }
      else {
        paVar4 = archive_string_conversion_from_charset(&a->archive,val,L'\0');
        *(archive_string_conv **)((long)pvVar1 + 0x188) = paVar4;
        wVar3 = L'\xffffffe2';
        if (paVar4 != (archive_string_conv *)0x0) {
          wVar3 = L'\0';
        }
      }
    }
    else {
      iVar2 = strcmp(key,"mac-ext");
      if (iVar2 == 0) {
        wVar3 = L'\0';
        uVar5 = 0;
        if (val != (char *)0x0) {
          uVar5 = (uint)(*val != '\0');
        }
        *(uint *)((long)pvVar1 + 0x1b0) = uVar5;
      }
      else {
        iVar2 = strcmp(key,"read_concatenated_archives");
        wVar3 = L'\xffffffec';
        if (iVar2 == 0) {
          wVar3 = L'\0';
          uVar5 = 0;
          if (val != (char *)0x0) {
            uVar5 = (uint)(*val != '\0');
          }
          *(uint *)((long)pvVar1 + 0x1b4) = uVar5;
        }
      }
    }
  }
  return wVar3;
}

Assistant:

static int
archive_read_format_tar_options(struct archive_read *a,
    const char *key, const char *val)
{
	struct tar *tar;
	int ret = ARCHIVE_FAILED;

	tar = (struct tar *)(a->format->data);
	if (strcmp(key, "compat-2x")  == 0) {
		/* Handle UTF-8 filenames as libarchive 2.x */
		tar->compat_2x = (val != NULL && val[0] != 0);
		tar->init_default_conversion = tar->compat_2x;
		return (ARCHIVE_OK);
	} else if (strcmp(key, "hdrcharset")  == 0) {
		if (val == NULL || val[0] == 0)
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "tar: hdrcharset option needs a character-set name");
		else {
			tar->opt_sconv =
			    archive_string_conversion_from_charset(
				&a->archive, val, 0);
			if (tar->opt_sconv != NULL)
				ret = ARCHIVE_OK;
			else
				ret = ARCHIVE_FATAL;
		}
		return (ret);
	} else if (strcmp(key, "mac-ext") == 0) {
		tar->process_mac_extensions = (val != NULL && val[0] != 0);
		return (ARCHIVE_OK);
	} else if (strcmp(key, "read_concatenated_archives") == 0) {
		tar->read_concatenated_archives = (val != NULL && val[0] != 0);
		return (ARCHIVE_OK);
	}

	/* Note: The "warn" return is just to inform the options
	 * supervisor that we didn't handle it.  It will generate
	 * a suitable error if no one used this option. */
	return (ARCHIVE_WARN);
}